

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void multi_getsock(Curl_easy *data,easy_pollset *ps)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  size_t sVar3;
  code *get_socks_cb;
  
  Curl_pollset_reset(data,ps);
  if (data->conn != (connectdata *)0x0) {
    switch(data->mstate) {
    case MSTATE_INIT:
    case MSTATE_PENDING:
    case MSTATE_SETUP:
    case MSTATE_CONNECT:
    case MSTATE_RATELIMITING:
    case MSTATE_DONE:
    case MSTATE_COMPLETED:
    case MSTATE_MSGSENT:
      goto switchD_00143297_caseD_0;
    case MSTATE_RESOLVING:
      Curl_pollset_add_socks(data,ps,Curl_resolv_getsock);
      return;
    case MSTATE_CONNECTING:
    case MSTATE_TUNNELING:
      get_socks_cb = connecting_getsock;
      break;
    case MSTATE_PROTOCONNECT:
    case MSTATE_PROTOCONNECTING:
      get_socks_cb = protocol_getsock;
      break;
    case MSTATE_DO:
    case MSTATE_DOING:
      get_socks_cb = doing_getsock;
      break;
    case MSTATE_DOING_MORE:
      get_socks_cb = domore_getsock;
      break;
    case MSTATE_DID:
    case MSTATE_PERFORMING:
      get_socks_cb = perform_getsock;
      break;
    default:
      Curl_failf(data,"multi_getsock: unexpected multi state %d");
      return;
    }
    Curl_pollset_add_socks(data,ps,get_socks_cb);
    Curl_conn_adjust_pollset(data,ps);
    if (((((ps->num == 0) && (sVar3 = Curl_llist_count(&(data->state).timeoutlist), sVar3 == 0)) &&
         (_Var2 = Curl_cwriter_is_paused(data), !_Var2)) &&
        ((_Var2 = Curl_creader_is_paused(data), !_Var2 &&
         (_Var2 = Curl_conn_is_ip_connected(data,0), _Var2)))) &&
       ((((data->set).field_0x8cd & 0x10) != 0 &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))))
       ) {
      Curl_infof(data,"WARNING: no socket in pollset or timer, transfer may stall!");
      return;
    }
  }
switchD_00143297_caseD_0:
  return;
}

Assistant:

static void multi_getsock(struct Curl_easy *data,
                          struct easy_pollset *ps)
{
  bool expect_sockets = TRUE;
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  Curl_pollset_reset(data, ps);
  if(!data->conn)
    return;

  switch(data->mstate) {
  case MSTATE_INIT:
  case MSTATE_PENDING:
  case MSTATE_SETUP:
  case MSTATE_CONNECT:
    /* nothing to poll for yet */
    expect_sockets = FALSE;
    break;

  case MSTATE_RESOLVING:
    Curl_pollset_add_socks(data, ps, Curl_resolv_getsock);
    /* connection filters are not involved in this phase. It's ok if we get no
     * sockets to wait for. Resolving can wake up from other sources. */
    expect_sockets = FALSE;
    break;

  case MSTATE_CONNECTING:
  case MSTATE_TUNNELING:
    Curl_pollset_add_socks(data, ps, connecting_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_PROTOCONNECT:
  case MSTATE_PROTOCONNECTING:
    Curl_pollset_add_socks(data, ps, protocol_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_DO:
  case MSTATE_DOING:
    Curl_pollset_add_socks(data, ps, doing_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_DOING_MORE:
    Curl_pollset_add_socks(data, ps, domore_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_DID: /* same as PERFORMING in regard to polling */
  case MSTATE_PERFORMING:
    Curl_pollset_add_socks(data, ps, perform_getsock);
    Curl_conn_adjust_pollset(data, ps);
    break;

  case MSTATE_RATELIMITING:
    /* we need to let time pass, ignore socket(s) */
    expect_sockets = FALSE;
    break;

  case MSTATE_DONE:
  case MSTATE_COMPLETED:
  case MSTATE_MSGSENT:
    /* nothing more to poll for */
    expect_sockets = FALSE;
    break;

  default:
    failf(data, "multi_getsock: unexpected multi state %d", data->mstate);
    DEBUGASSERT(0);
    expect_sockets = FALSE;
    break;
  }

  if(expect_sockets && !ps->num &&
     !Curl_llist_count(&data->state.timeoutlist) &&
     !Curl_cwriter_is_paused(data) && !Curl_creader_is_paused(data) &&
     Curl_conn_is_ip_connected(data, FIRSTSOCKET)) {
    /* We expected sockets for POLL monitoring, but none are set.
     * We are not waiting on any timer.
     * None of the READ/WRITE directions are paused.
     * We are connected to the server on IP level, at least. */
    infof(data, "WARNING: no socket in pollset or timer, transfer may stall!");
    DEBUGASSERT(0);
  }
}